

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O1

bool __thiscall crnlib::dxt_image::flip_x(dxt_image *this)

{
  byte bVar1;
  uint8 uVar2;
  uint8 uVar3;
  element_type eVar4;
  uint value;
  uint value_00;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  uint bit_ofs;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  dxt_image *pdVar13;
  uint y;
  int iVar14;
  long lVar15;
  ulong uVar16;
  uint y_1;
  uint y_00;
  uint uVar17;
  element tmp;
  dxt3_block local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  dxt_image *local_58;
  int local_50;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (((uint)(this->m_format + ~cDXN_YX) < 5) ||
     (uVar10 = this->m_width, 4 < uVar10 && (uVar10 & 3) != 0)) {
    bVar8 = false;
  }
  else {
    bVar8 = true;
    if (uVar10 != 1) {
      local_58 = this;
      local_5c = this->m_blocks_x >> 1;
      if (1 < this->m_blocks_x) {
        uVar9 = 0;
        do {
          flip_col(local_58,uVar9);
          uVar9 = uVar9 + 1;
        } while (local_5c != uVar9);
      }
      if ((local_58->m_blocks_x & 1) != 0) {
        local_64 = local_58->m_width;
        local_48 = 4;
        if (local_64 < 4) {
          local_48 = (ulong)local_64;
        }
        if (local_58->m_blocks_y != 0) {
          local_60 = (uint)(local_48 >> 1);
          local_50 = (int)local_48 * 3 + -3;
          local_40 = 0;
          pdVar13 = local_58;
          uVar9 = local_5c;
          do {
            uVar5 = (ulong)pdVar13->m_num_elements_per_block;
            if (pdVar13->m_num_elements_per_block != 0) {
              local_38 = 0;
              do {
                local_70.m_alpha =
                     *&pdVar13->m_pElements
                       [(int)local_38 + (pdVar13->m_blocks_x * (int)local_40 + uVar9) * (int)uVar5].
                       m_bytes;
                eVar4 = pdVar13->m_element_type[local_38];
                if (eVar4 == cAlphaDXT5) {
                  if (1 < local_64) {
                    iVar11 = 0;
                    uVar10 = 0;
                    iVar12 = local_50;
                    do {
                      local_4c = uVar10;
                      iVar14 = 0;
                      do {
                        uVar16 = (ulong)((uint)(iVar11 + iVar14) >> 3);
                        uVar2 = local_70.m_alpha[uVar16 + 2];
                        uVar3 = local_70.m_alpha[uVar16 + 3];
                        bVar6 = (byte)(iVar11 + iVar14) & 7;
                        uVar10 = iVar12 + iVar14;
                        uVar5 = (ulong)(uVar10 >> 3);
                        uVar17 = (uint)local_70.m_alpha[uVar5 + 2];
                        if (uVar10 < 0x28) {
                          uVar17 = (uint)CONCAT11(local_70.m_alpha[uVar5 + 3],
                                                  local_70.m_alpha[uVar5 + 2]);
                        }
                        bVar7 = (byte)uVar10 & 7;
                        *(ushort *)(local_70.m_alpha + uVar16 + 2) =
                             (ushort)((uVar17 >> bVar7 & 7) << bVar6) |
                             ~(ushort)(7 << bVar6) & CONCAT11(local_70.m_alpha[uVar16 + 3],uVar2);
                        uVar17 = (uint)local_70.m_alpha[uVar5 + 2];
                        if (uVar10 < 0x28) {
                          uVar17 = (uint)CONCAT11(local_70.m_alpha[uVar5 + 3],
                                                  local_70.m_alpha[uVar5 + 2]);
                        }
                        uVar17 = ((ushort)(CONCAT11(uVar3,uVar2) >> bVar6) & 7) << bVar7 |
                                 ~(7 << bVar7) & uVar17;
                        local_70.m_alpha[uVar5 + 2] = (uint8)uVar17;
                        if (uVar10 < 0x28) {
                          local_70.m_alpha[uVar5 + 3] = (uint8)(uVar17 >> 8);
                        }
                        iVar14 = iVar14 + 0xc;
                      } while (iVar14 != 0x30);
                      uVar10 = local_4c + 1;
                      iVar12 = iVar12 + -3;
                      iVar11 = iVar11 + 3;
                    } while (uVar10 != local_60);
                  }
                }
                else if (eVar4 == cAlphaDXT3) {
                  if (1 < local_64) {
                    uVar10 = 0;
                    do {
                      uVar9 = ~uVar10 + (int)local_48;
                      y_00 = 0;
                      do {
                        value = dxt3_block::get_alpha(&local_70,uVar10,y_00,false);
                        value_00 = dxt3_block::get_alpha(&local_70,uVar9,y_00,false);
                        dxt3_block::set_alpha(&local_70,uVar10,y_00,value_00,false);
                        dxt3_block::set_alpha(&local_70,uVar9,y_00,value,false);
                        y_00 = y_00 + 1;
                      } while (y_00 != 4);
                      uVar10 = uVar10 + 1;
                    } while (uVar10 != local_60);
                  }
                }
                else if ((eVar4 == cColorDXT1) && (1 < local_64)) {
                  uVar10 = 0;
                  do {
                    bVar7 = (byte)uVar10 * '\x02';
                    bVar6 = (~(byte)uVar10 + (char)local_48) * '\x02';
                    lVar15 = 0;
                    do {
                      bVar1 = local_70.m_alpha[lVar15 + 4];
                      local_70.m_alpha[lVar15 + 4] =
                           (byte)((bVar1 >> (bVar7 & 0x1f) & 3) << (bVar6 & 0x1f)) |
                           ((byte)((bVar1 >> (bVar6 & 0x1f) & 3) << (bVar7 & 0x1f)) |
                           bVar1 & ~(byte)(3 << (bVar7 & 0x1f))) & ~(byte)(3 << (bVar6 & 0x1f));
                      lVar15 = lVar15 + 1;
                    } while (lVar15 != 4);
                    uVar10 = uVar10 + 1;
                  } while (uVar10 != local_60);
                }
                *&local_58->m_pElements
                  [(local_58->m_blocks_x * (int)local_40 + local_5c) *
                   local_58->m_num_elements_per_block + (int)local_38].m_bytes = local_70.m_alpha;
                local_38 = local_38 + 1;
                uVar5 = (ulong)local_58->m_num_elements_per_block;
                pdVar13 = local_58;
                uVar9 = local_5c;
              } while (local_38 < uVar5);
            }
            uVar10 = (int)local_40 + 1;
            local_40 = (ulong)uVar10;
          } while (uVar10 < pdVar13->m_blocks_y);
          bVar8 = true;
        }
      }
    }
  }
  return bVar8;
}

Assistant:

bool dxt_image::flip_x()
    {
        if (m_format == cETC1 || m_format == cETC2 || m_format == cETC2A || m_format == cETC1S || m_format == cETC2AS)
        {
            // Can't reliably flip ETCn textures (because of asymmetry in the 555/333 differential coding of subblock colors).
            return false;
        }

        if ((m_width & 3) && (m_width > 4))
        {
            return false;
        }

        if (m_width == 1)
        {
            return true;
        }

        const uint mid_x = m_blocks_x / 2;

        for (uint x = 0; x < mid_x; x++)
        {
            flip_col(x);
        }

        if (m_blocks_x & 1)
        {
            const uint w = math::minimum(m_width, 4U);
            for (uint y = 0; y < m_blocks_y; y++)
            {
                for (uint e = 0; e < get_elements_per_block(); e++)
                {
                    element tmp(get_element(mid_x, y, e));
                    switch (get_element_type(e))
                    {
                    case cColorDXT1:
                        reinterpret_cast<dxt1_block*>(&tmp)->flip_x(w, 4);
                        break;
                    case cAlphaDXT3:
                        reinterpret_cast<dxt3_block*>(&tmp)->flip_x(w, 4);
                        break;
                    case cAlphaDXT5:
                        reinterpret_cast<dxt5_block*>(&tmp)->flip_x(w, 4);
                        break;
                    default:
                        CRNLIB_ASSERT(0);
                        break;
                    }
                    get_element(mid_x, y, e) = tmp;
                }
            }
        }

        return true;
    }